

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

int percent_success(int spell)

{
  int iVar1;
  schar sVar2;
  int iVar3;
  int local_38;
  int local_30;
  int local_2c;
  int learning;
  int skill;
  int difficulty;
  int statused;
  int special;
  int splcaster;
  int chance;
  int spell_local;
  
  iVar1 = urole.spelheal;
  iVar3 = urole.spelbase;
  statused = urole.spelbase;
  sVar2 = acurr(urole.spelstat);
  if (((uarm == (obj *)0x0) || ((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) < 0xb)) ||
     (0x11 < (*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f))) {
    if ((uarmc != (obj *)0x0) && (uarmc->otyp == 0x81)) {
      statused = iVar3 - urole.spelarmr;
    }
  }
  else {
    if ((uarmc == (obj *)0x0) || (uarmc->otyp != 0x81)) {
      local_2c = urole.spelarmr;
    }
    else {
      local_2c = urole.spelarmr / 2;
    }
    statused = local_2c + iVar3;
  }
  if (uarms != (obj *)0x0) {
    statused = urole.spelshld + statused;
  }
  if ((((uarmh != (obj *)0x0) && (10 < (*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f)))
      && ((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) < 0x12)) &&
     (uarmh->otyp != 0x51)) {
    statused = statused + 4;
  }
  if ((uarmh != (obj *)0x0) && (uarmh->otyp == 0x4f)) {
    statused = statused + 4;
  }
  if (((uarmg != (obj *)0x0) && (10 < (*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f))) &&
     ((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) < 0x12)) {
    statused = statused + 6;
  }
  if (((uarmf != (obj *)0x0) && (10 < (*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f))) &&
     ((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) < 0x12)) {
    statused = statused + 2;
  }
  if (spl_book[spell].sp_id == urole.spelspec) {
    statused = urole.spelsbon + statused;
  }
  if (((spl_book[spell].sp_id == 0x185) || (spl_book[spell].sp_id == 0x196)) ||
     (((spl_book[spell].sp_id == 0x189 ||
       ((spl_book[spell].sp_id == 0x191 || (spl_book[spell].sp_id == 0x197)))) ||
      (spl_book[spell].sp_id == 0x19a)))) {
    statused = iVar1 + statused;
  }
  if (0x14 < statused) {
    statused = 0x14;
  }
  iVar3 = spell_skilltype((int)spl_book[spell].sp_id);
  local_30 = (int)u.weapon_skills[iVar3].skill;
  if (local_30 < 2) {
    local_30 = 1;
  }
  iVar3 = (spl_book[spell].sp_lev + -1) * 4 - ((local_30 + -1) * 6 + u.ulevel / 3 + 1);
  if (iVar3 < 1) {
    local_38 = (iVar3 * -0xf) / (int)spl_book[spell].sp_lev;
    if (0x14 < local_38) {
      local_38 = 0x14;
    }
  }
  else {
    local_38 = isqrt(iVar3 * 900 + 2000);
    local_38 = -local_38;
  }
  special = (sVar2 * 0xb) / 2 + local_38;
  if (special < 0) {
    special = 0;
  }
  if (0x78 < special) {
    special = 0x78;
  }
  if ((uarms != (obj *)0x0) && (iVar3 = weight(uarms), (int)(uint)objects[0x88].oc_weight < iVar3))
  {
    if (spl_book[spell].sp_id == urole.spelspec) {
      special = special / 2;
    }
    else {
      special = special / 4;
    }
  }
  special = (special * (0x14 - statused)) / 0xf - statused;
  if (100 < special) {
    special = 100;
  }
  if (special < 0) {
    special = 0;
  }
  return special;
}

Assistant:

static int percent_success(int spell)
{
	/* Intrinsic and learned ability are combined to calculate
	 * the probability of player's success at cast a given spell.
	 */
	int chance, splcaster, special, statused;
	int difficulty;
	int skill;

	/* Calculate intrinsic ability (splcaster) */

	splcaster = urole.spelbase;
	special = urole.spelheal;
	statused = ACURR(urole.spelstat);

	if (uarm && is_metallic(uarm))
	    splcaster += (uarmc && uarmc->otyp == ROBE) ?
		urole.spelarmr/2 : urole.spelarmr;
	else if (uarmc && uarmc->otyp == ROBE)
	    splcaster -= urole.spelarmr;
	if (uarms) splcaster += urole.spelshld;

	if (uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE)
		splcaster += uarmhbon;
	if (uarmh && uarmh->otyp == TINFOIL_HAT)
		splcaster += uarmhbon;
	if (uarmg && is_metallic(uarmg)) splcaster += uarmgbon;
	if (uarmf && is_metallic(uarmf)) splcaster += uarmfbon;

	if (spellid(spell) == urole.spelspec)
		splcaster += urole.spelsbon;

	/* `healing spell' bonus */
	if (spellid(spell) == SPE_HEALING ||
	    spellid(spell) == SPE_EXTRA_HEALING ||
	    spellid(spell) == SPE_CURE_BLINDNESS ||
	    spellid(spell) == SPE_CURE_SICKNESS ||
	    spellid(spell) == SPE_RESTORE_ABILITY ||
	    spellid(spell) == SPE_REMOVE_CURSE) splcaster += special;

	if (splcaster > 20) splcaster = 20;

	/* Calculate learned ability */

	/* Players basic likelihood of being able to cast any spell
	 * is based of their `magic' statistic. (Int or Wis)
	 */
	chance = 11 * statused / 2;

	/*
	 * High level spells are harder.  Easier for higher level casters.
	 * The difficulty is based on the hero's level and their skill level
	 * in that spell type.
	 */
	skill = P_SKILL(spell_skilltype(spellid(spell)));
	skill = max(skill,P_UNSKILLED) - 1;	/* unskilled => 0 */
	difficulty= (spellev(spell)-1) * 4 - ((skill * 6) + (u.ulevel/3) + 1);

	if (difficulty > 0) {
		/* Player is too low level or unskilled. */
		chance -= isqrt(900 * difficulty + 2000);
	} else {
		/* Player is above level.  Learning continues, but the
		 * law of diminishing returns sets in quickly for
		 * low-level spells.  That is, a player quickly gains
		 * no advantage for raising level.
		 */
		int learning = 15 * -difficulty / spellev(spell);
		chance += learning > 20 ? 20 : learning;
	}

	/* Clamp the chance: >18 stat and advanced learning only help
	 * to a limit, while chances below "hopeless" only raise the
	 * specter of overflowing 16-bit ints (and permit wearing a
	 * shield to raise the chances :-).
	 */
	if (chance < 0) chance = 0;
	if (chance > 120) chance = 120;

	/* Wearing anything but a light shield makes it very awkward
	 * to cast a spell.  The penalty is not quite so bad for the
	 * player's role-specific spell.
	 */
	if (uarms && weight(uarms) > (int) objects[SMALL_SHIELD].oc_weight) {
		if (spellid(spell) == urole.spelspec) {
			chance /= 2;
		} else {
			chance /= 4;
		}
	}

	/* Finally, chance (based on player intell/wisdom and level) is
	 * combined with ability (based on player intrinsics and
	 * encumbrances).  No matter how intelligent/wise and advanced
	 * a player is, intrinsics and encumbrance can prevent casting;
	 * and no matter how able, learning is always required.
	 */
	chance = chance * (20-splcaster) / 15 - splcaster;

	/* Clamp to percentile */
	if (chance > 100) chance = 100;
	if (chance < 0) chance = 0;

	return chance;
}